

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageUtil.cpp
# Opt level: O0

void __thiscall
vkt::pipeline::TestTextureCubeArray::TestTextureCubeArray
          (TestTextureCubeArray *this,TextureFormat *format,int size,int arraySize)

{
  vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> local_48;
  int local_20;
  int local_1c;
  int arraySize_local;
  int size_local;
  TextureFormat *format_local;
  TestTextureCubeArray *this_local;
  
  local_20 = arraySize;
  local_1c = size;
  _arraySize_local = format;
  format_local = (TextureFormat *)this;
  TestTexture::TestTexture(&this->super_TestTexture,format,size,size,arraySize);
  (this->super_TestTexture)._vptr_TestTexture = (_func_int **)&PTR__TestTextureCubeArray_01661048;
  tcu::TextureCubeArray::TextureCubeArray(&this->m_texture,_arraySize_local,local_1c,local_20);
  allocateLevels<tcu::TextureCubeArray>(&this->m_texture);
  getLevelsVector<tcu::TextureCubeArray>(&local_48,&this->m_texture);
  TestTexture::populateLevels(&this->super_TestTexture,&local_48);
  std::vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>::~vector(&local_48);
  return;
}

Assistant:

TestTextureCubeArray::TestTextureCubeArray (const tcu::TextureFormat& format, int size, int arraySize)
	: TestTexture	(format, size, size, arraySize)
	, m_texture		(format, size, arraySize)
{
	allocateLevels(m_texture);
	TestTexture::populateLevels(getLevelsVector(m_texture));
}